

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::CopyImageToBuffer::WriteImplementation::WriteImplementation
          (WriteImplementation *this,OperationContext *context,Resource *resource)

{
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> data_00;
  Allocator *pAVar1;
  Allocator *pAVar2;
  BufferResource *pBVar3;
  Buffer *pBVar4;
  void *pData;
  VkDeviceSize offset;
  Image *this_00;
  VkImageSubresourceLayers VVar5;
  Buffer *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  VkDevice pVVar6;
  DefaultDeleter<vkt::synchronization::Image> local_165;
  deUint32 local_164;
  VkImageCreateInfo local_160;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> local_108;
  Image *local_f8;
  VkDeviceMemory local_e8;
  Allocation *local_e0;
  Allocation *alloc;
  VkBufferCreateInfo local_d0;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> local_98;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> *local_88
  ;
  VkExtent3D local_78;
  VkExtent3D local_68;
  TextureFormat local_58;
  deUint32 local_50;
  undefined4 local_4c;
  deUint32 pixelSize;
  VkFormat format;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  Resource *local_20;
  Resource *resource_local;
  OperationContext *context_local;
  WriteImplementation *this_local;
  
  local_20 = resource;
  resource_local = (Resource *)context;
  context_local = (OperationContext *)this;
  Operation::Operation(&this->super_Operation);
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__WriteImplementation_016b32a0;
  this->m_context = (OperationContext *)resource_local;
  this->m_resource = local_20;
  ::vk::makeImageSubresourceRange(&this->m_subresourceRange,1,0,1,0,1);
  VVar5 = ::vk::makeImageSubresourceLayers(1,0,0,1);
  this->m_subresourceLayers = VVar5;
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::MovePtr
            (&this->m_hostBuffer);
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::MovePtr
            (&this->m_image);
  device = (VkDevice)OperationContext::getDeviceInterface(this->m_context);
  allocator = (Allocator *)OperationContext::getDevice(this->m_context);
  _pixelSize = OperationContext::getAllocator(this->m_context);
  local_4c = 0x25;
  local_58 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  local_50 = tcu::getPixelSize(local_58);
  pBVar3 = Resource::getBuffer(this->m_resource);
  local_78 = get2DImageExtentWithSize(pBVar3->size,local_50);
  this->m_imageExtent = local_78;
  local_68 = local_78;
  pBVar4 = (Buffer *)operator_new(0x30);
  pVVar6 = device;
  pAVar2 = allocator;
  pAVar1 = _pixelSize;
  pBVar3 = Resource::getBuffer(this->m_resource);
  makeBufferCreateInfo(&local_d0,pBVar3->size,1);
  alloc._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  synchronization::Buffer::Buffer
            (pBVar4,(DeviceInterface *)pVVar6,(VkDevice)pAVar2,pAVar1,&local_d0,
             ::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vkt::synchronization::Buffer>::DefaultDeleter
            ((DefaultDeleter<vkt::synchronization::Buffer> *)((long)&alloc + 3));
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::MovePtr
            ((MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_98);
  local_88 = de::details::MovePtr::operator_cast_to_PtrData(&local_98,(MovePtr *)pBVar4);
  data._8_8_ = in_stack_fffffffffffffdf0;
  data.ptr = in_stack_fffffffffffffde8;
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  operator=(&this->m_hostBuffer,data);
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::~MovePtr
            ((MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_98);
  pBVar4 = de::details::
           UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
           ::operator->(&(this->m_hostBuffer).
                         super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                       );
  local_e0 = synchronization::Buffer::getAllocation(pBVar4);
  pData = ::vk::Allocation::getHostPtr(local_e0);
  pBVar3 = Resource::getBuffer(this->m_resource);
  fillPattern(pData,pBVar3->size);
  pVVar6 = device;
  pAVar1 = allocator;
  local_e8 = ::vk::Allocation::getMemory(local_e0);
  offset = ::vk::Allocation::getOffset(local_e0);
  pBVar3 = Resource::getBuffer(this->m_resource);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)pVVar6,(VkDevice)pAVar1,local_e8,offset,pBVar3->size);
  this_00 = (Image *)operator_new(0x30);
  pAVar2 = allocator;
  pAVar1 = _pixelSize;
  pVVar6 = device;
  makeImageCreateInfo(&local_160,VK_IMAGE_TYPE_2D,&this->m_imageExtent,VK_FORMAT_R8G8B8A8_UNORM,3);
  local_164 = ::vk::MemoryRequirement::Any.m_flags;
  synchronization::Image::Image
            (this_00,(DeviceInterface *)pVVar6,(VkDevice)pAVar2,pAVar1,&local_160,
             ::vk::MemoryRequirement::Any);
  de::DefaultDeleter<vkt::synchronization::Image>::DefaultDeleter(&local_165);
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::MovePtr
            ((MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              *)&local_108);
  local_f8 = (Image *)de::details::MovePtr::operator_cast_to_PtrData(&local_108,(MovePtr *)this_00);
  data_00._8_8_ = pVVar6;
  data_00.ptr = local_f8;
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::operator=
            (&this->m_image,data_00);
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::~MovePtr
            ((MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              *)&local_108);
  return;
}

Assistant:

WriteImplementation (OperationContext& context, Resource& resource)
		: m_context				(context)
		, m_resource			(resource)
		, m_subresourceRange	(makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u))
		, m_subresourceLayers	(makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u))
	{
		DE_ASSERT(m_resource.getType() == RESOURCE_TYPE_BUFFER);

		const DeviceInterface&	vk			= m_context.getDeviceInterface();
		const VkDevice			device		= m_context.getDevice();
		Allocator&				allocator	= m_context.getAllocator();
		const VkFormat			format		= VK_FORMAT_R8G8B8A8_UNORM;
		const deUint32			pixelSize	= tcu::getPixelSize(mapVkFormat(format));

		DE_ASSERT((m_resource.getBuffer().size % pixelSize) == 0);
		m_imageExtent = get2DImageExtentWithSize(m_resource.getBuffer().size, pixelSize);

		// Source data staging buffer
		m_hostBuffer = de::MovePtr<Buffer>(new Buffer(
			vk, device, allocator, makeBufferCreateInfo(m_resource.getBuffer().size, VK_BUFFER_USAGE_TRANSFER_SRC_BIT), MemoryRequirement::HostVisible));

		const Allocation& alloc = m_hostBuffer->getAllocation();
		fillPattern(alloc.getHostPtr(), m_resource.getBuffer().size);
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_resource.getBuffer().size);

		// Source data image
		m_image = de::MovePtr<Image>(new Image(
			vk, device, allocator, makeImageCreateInfo(VK_IMAGE_TYPE_2D, m_imageExtent, format, VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT), MemoryRequirement::Any));
	}